

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des3_cbc3_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  ssh_cipheralg *psVar1;
  LR LVar2;
  LR LVar3;
  
  for (; 0 < len; len = len + -8) {
    LVar2 = des_load_lr(vdata);
    LVar2 = des_IP(LVar2);
    LVar3 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x13),0xf,0xffffffffffffffff);
    psVar1 = ciph[-1].vt;
    *(LR *)(ciph + -1) = LVar2;
    LVar2 = des_inner_cipher((LR)((ulong)LVar3 ^ (ulong)psVar1 ^ (ulong)ciph[-2].vt),
                             (des_keysched *)(ciph + -0x23),0,1);
    *(LR *)(ciph + -2) = LVar2;
    LVar3 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x33),0xf,0xffffffffffffffff);
    psVar1 = ciph[-3].vt;
    *(LR *)(ciph + -3) = LVar2;
    LVar2 = des_FP((LR)((ulong)LVar3 ^ (ulong)psVar1));
    des_store_lr(vdata,LVar2);
    vdata = (void *)((long)vdata + 8);
  }
  return;
}

Assistant:

static void des3_cbc3_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc3_ctx *ctx = container_of(ciph, struct des3_cbc3_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        /* Load and IP the input */
        LR lr = des_IP(des_load_lr(data));
        LR ciphertext;

        /* Do three passes of CBC, with the middle one inverted. */
        ciphertext = lr;
        lr = des_inner_cipher(ciphertext, &ctx->sched[2], DECIPHER);
        lr = des_xor_lr(lr, ctx->iv[2]);
        ctx->iv[2] = ciphertext;

        lr = des_xor_lr(lr, ctx->iv[1]);
        lr = des_inner_cipher(lr, &ctx->sched[1], ENCIPHER);
        ctx->iv[1] = lr;

        ciphertext = lr;
        lr = des_inner_cipher(ciphertext, &ctx->sched[0], DECIPHER);
        lr = des_xor_lr(lr, ctx->iv[0]);
        ctx->iv[0] = ciphertext;

        des_store_lr(data, des_FP(lr));
    }
}